

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

void __thiscall MIDIStreamer::StartPlayback(MIDIStreamer *this)

{
  uint uVar1;
  int iVar2;
  uint buffer_num;
  
  (*(this->super_MusInfo)._vptr_MusInfo[0x1a])();
  this->LoopLimit = 0;
  iVar2 = (*this->MIDI->_vptr_MIDIDevice[7])(this->MIDI,(ulong)(uint)this->Division);
  if (iVar2 == 0) {
    this->Tempo = this->InitialTempo;
    iVar2 = (*this->MIDI->_vptr_MIDIDevice[6])();
    if (iVar2 == 0) {
      (*(this->super_MusInfo)._vptr_MusInfo[2])(this);
      OutputVolume(this,this->Volume);
      this->BufferNum = 0;
      buffer_num = 0;
      do {
        iVar2 = FillBuffer(this,buffer_num,0x80,100000);
        if (iVar2 != 0) {
LAB_0035b657:
          (*(this->super_MusInfo)._vptr_MusInfo[7])(this);
          return;
        }
        iVar2 = (*this->MIDI->_vptr_MIDIDevice[9])(this->MIDI,this->Buffer + this->BufferNum);
        if (iVar2 != 0) {
          Printf("Initial midiStreamOut failed\n");
          goto LAB_0035b657;
        }
        uVar1 = this->BufferNum;
        buffer_num = uVar1 ^ 1;
        this->BufferNum = buffer_num;
        if (uVar1 == 1) {
          return;
        }
      } while( true );
    }
  }
  Printf(200,"Setting MIDI stream speed failed\n");
  (*this->MIDI->_vptr_MIDIDevice[3])();
  return;
}

Assistant:

void MIDIStreamer::StartPlayback()
{
	Precache();
	LoopLimit = 0;

	// Set time division and tempo.
	if (0 != MIDI->SetTimeDiv(Division) ||
		0 != MIDI->SetTempo(Tempo = InitialTempo))
	{
		Printf(PRINT_BOLD, "Setting MIDI stream speed failed\n");
		MIDI->Close();
		return;
	}

	MusicVolumeChanged();	// set volume to current music's properties
	OutputVolume(Volume);

#ifdef _WIN32
	ResetEvent(ExitEvent);
	ResetEvent(BufferDoneEvent);
#endif

	// Fill the initial buffers for the song.
	BufferNum = 0;
	do
	{
		int res = FillBuffer(BufferNum, MAX_EVENTS, MAX_TIME);
		if (res == SONG_MORE)
		{
			if (0 != MIDI->StreamOutSync(&Buffer[BufferNum]))
			{
				Printf ("Initial midiStreamOut failed\n");
				Stop();
				return;
			}
			BufferNum ^= 1;
		}
		else if (res == SONG_DONE)
		{
			// Do not play super short songs that can't fill the initial two buffers.
			Stop();
			return;
		}
		else
		{
			Stop();
			return;
		}
	}
	while (BufferNum != 0);
}